

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

bool BinaryenMemoryIs64(BinaryenModuleRef module,char *name)

{
  pointer puVar1;
  char *pcVar2;
  IString *this;
  Memory *pMVar3;
  Fatal *this_00;
  undefined1 reuse;
  long in_RCX;
  string_view sVar4;
  undefined1 local_1a8 [392];
  char *local_20;
  char *name_local;
  
  local_20 = name;
  if (name == (char *)0x0) {
    puVar1 = (module->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    in_RCX = (long)(module->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    if (in_RCX == 8) {
      local_20 = *(char **)((long)(puVar1->_M_t).
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t + 8);
    }
  }
  pcVar2 = local_20;
  reuse = (undefined1)in_RCX;
  this = (IString *)strlen(local_20);
  sVar4._M_str = (char *)0x0;
  sVar4._M_len = (size_t)pcVar2;
  sVar4 = wasm::IString::interned(this,sVar4,(bool)reuse);
  pMVar3 = wasm::Module::getMemoryOrNull(module,(Name)sVar4);
  if (pMVar3 != (Memory *)0x0) {
    return (pMVar3->addressType).id == 3;
  }
  wasm::Fatal::Fatal((Fatal *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"invalid memory \'",0x10);
  this_00 = wasm::Fatal::operator<<((Fatal *)local_1a8,&local_20);
  wasm::Fatal::operator<<(this_00,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal((Fatal *)local_1a8);
}

Assistant:

bool BinaryenMemoryIs64(BinaryenModuleRef module, const char* name) {
  // Maintaining compatibility for instructions with a single memory
  if (name == nullptr && module->memories.size() == 1) {
    name = module->memories[0]->name.str.data();
  }
  auto* memory = ((Module*)module)->getMemoryOrNull(name);
  if (memory == nullptr) {
    Fatal() << "invalid memory '" << name << "'.";
  }
  return memory->is64();
}